

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

value_type __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::find_smallest(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  bool bVar1;
  const_reference cVar2;
  pointer pAVar3;
  Value VVar4;
  reference pvVar5;
  size_type in_RDI;
  AdjacencyIterator it;
  unsigned_long *row;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  double minval;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffff98;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_ffffffffffffffa0;
  AdjacencyIterator in_stack_ffffffffffffffc0;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_38;
  reference local_30;
  unsigned_long *local_28;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_20;
  long local_18;
  value_type local_10;
  
  local_10 = std::numeric_limits<double>::max();
  local_18 = in_RDI + 0x18;
  local_20._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff98
                 );
  local_28 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_ffffffffffffffa0,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    local_30 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_20);
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffc0._M_current,
                       in_RDI);
    if (!cVar2) {
      local_38._M_current =
           (Adjacency<unsigned_long> *)
           andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
           adjacenciesFromVertexBegin(in_stack_ffffffffffffff98,0x1d1e07);
      while( true ) {
        in_stack_ffffffffffffffc0 =
             andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
             adjacenciesFromVertexEnd(in_stack_ffffffffffffff98,0x1d1e21);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_ffffffffffffffa0,
                           (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_ffffffffffffff98);
        if (!bVar1) break;
        pAVar3 = __gnu_cxx::
                 __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                 ::operator->(&local_38);
        andres::graph::Adjacency<unsigned_long>::vertex(pAVar3);
        col_of_idx(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
        cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)
                           in_stack_ffffffffffffffc0._M_current,in_RDI);
        if (!cVar2) {
          this_00 = *(vector<double,_std::allocator<double>_> **)(in_RDI + 8);
          pAVar3 = __gnu_cxx::
                   __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                   ::operator->(&local_38);
          VVar4 = andres::graph::Adjacency<unsigned_long>::edge(pAVar3);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,VVar4);
          if (*pvVar5 < local_10) {
            in_stack_ffffffffffffffa0 =
                 *(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                   **)(in_RDI + 8);
            pAVar3 = __gnu_cxx::
                     __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                     ::operator->(&local_38);
            VVar4 = andres::graph::Adjacency<unsigned_long>::edge(pAVar3);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0
                                ,VVar4);
            local_10 = *pvVar5;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
        ::operator++(&local_38);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_20);
  }
  return local_10;
}

Assistant:

typename Matching<GRAPH, COST, MASK>::value_type
Matching<GRAPH, COST, MASK>::find_smallest() const
{
    auto minval = std::numeric_limits<value_type>::max();
    for (auto const& row : rows_) {
        // consider only non-covered rows.
        if (row_cover[row])
            continue;
        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it)
            // consider only non-covered columns.
            if (!col_cover[col_of_idx(it->vertex())] &&
                costs_[it->edge()] < minval)
                minval = costs_[it->edge()];
    }
    return minval;
}